

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_templates.h
# Opt level: O0

GLHorizonInfo * __thiscall
UniqueList<GLHorizonInfo>::Get(UniqueList<GLHorizonInfo> *this,GLHorizonInfo *t)

{
  uint uVar1;
  GLHorizonInfo *__s1;
  uint uVar2;
  int iVar3;
  GLHorizonInfo **ppGVar4;
  GLHorizonInfo *local_30;
  GLHorizonInfo *newo;
  GLHorizonInfo *pGStack_20;
  uint i;
  GLHorizonInfo *t_local;
  UniqueList<GLHorizonInfo> *this_local;
  
  newo._4_4_ = 0;
  pGStack_20 = t;
  t_local = (GLHorizonInfo *)this;
  while( true ) {
    uVar1 = newo._4_4_;
    uVar2 = TArray<GLHorizonInfo_*,_GLHorizonInfo_*>::Size(&this->Array);
    __s1 = pGStack_20;
    if (uVar2 <= uVar1) {
      local_30 = FreeList<GLHorizonInfo>::GetNew((FreeList<GLHorizonInfo> *)&this->field_0x10);
      GLHorizonInfo::operator=(local_30,pGStack_20);
      TArray<GLHorizonInfo_*,_GLHorizonInfo_*>::Push(&this->Array,&local_30);
      return local_30;
    }
    ppGVar4 = TArray<GLHorizonInfo_*,_GLHorizonInfo_*>::operator[](&this->Array,(ulong)newo._4_4_);
    iVar3 = memcmp(__s1,*ppGVar4,0x60);
    if (iVar3 == 0) break;
    newo._4_4_ = newo._4_4_ + 1;
  }
  ppGVar4 = TArray<GLHorizonInfo_*,_GLHorizonInfo_*>::operator[](&this->Array,(ulong)newo._4_4_);
  return *ppGVar4;
}

Assistant:

T * Get(T * t)
	{
		for(unsigned i=0;i<Array.Size();i++)
		{
			if (!memcmp(t, Array[i], sizeof(T))) return Array[i];
		}
		T * newo=TheFreeList.GetNew();

		*newo=*t;
		Array.Push(newo);
		return newo;
	}